

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManPushForwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  Nwk_Obj_t *pPred_00;
  bool bVar2;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pPred_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjVisitedTop(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetVisitedTop(pObj);
    iVar1 = Nwk_ObjIsSink(pObj);
    if (iVar1 == 0) {
      local_2c = 0;
      while( true ) {
        bVar2 = false;
        if (local_2c < pObj->nFanouts) {
          pNStack_28 = pObj->pFanio[pObj->nFanins + local_2c];
          bVar2 = pNStack_28 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar2) {
          iVar1 = Nwk_ObjHasFlow(pObj);
          if ((iVar1 != 0) && (iVar1 = Nwk_ObjIsCi(pObj), iVar1 == 0)) {
            pPred_00 = Nwk_ObjPred(pObj);
            iVar1 = Nwk_ManPushForwardBot_rec(pObj,pPred_00);
            if (iVar1 != 0) {
              Nwk_ObjClearFlow(pObj);
              iVar1 = Nwk_ObjSetPred(pObj,(Nwk_Obj_t *)0x0);
              return iVar1;
            }
          }
          return 0;
        }
        iVar1 = Nwk_ManPushForwardBot_rec(pNStack_28,pPred);
        if (iVar1 != 0) break;
        local_2c = local_2c + 1;
      }
      pObj_local._4_4_ = 1;
    }
    else {
      pObj_local._4_4_ = 1;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManPushForwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) && !Nwk_ObjIsCi(pObj) )
        if ( Nwk_ManPushForwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}